

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlParserInputBufferCreateFilename(void)

{
  int iVar1;
  xmlCharEncoding val;
  int iVar2;
  char *val_00;
  xmlParserInputBufferPtr val_01;
  int local_2c;
  int n_enc;
  xmlCharEncoding enc;
  int n_URI;
  char *URI;
  xmlParserInputBufferPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (n_enc = 0; n_enc < 6; n_enc = n_enc + 1) {
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      iVar1 = xmlMemBlocks();
      val_00 = gen_fileoutput(n_enc,0);
      val = gen_xmlCharEncoding(local_2c,1);
      val_01 = (xmlParserInputBufferPtr)xmlParserInputBufferCreateFilename(val_00,val);
      desret_xmlParserInputBufferPtr(val_01);
      call_tests = call_tests + 1;
      des_fileoutput(n_enc,val_00,0);
      des_xmlCharEncoding(local_2c,val,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlParserInputBufferCreateFilename",
               (ulong)(uint)(iVar2 - iVar1));
        ret_val._4_4_ = ret_val._4_4_ + 1;
        printf(" %d",(ulong)(uint)n_enc);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlParserInputBufferCreateFilename(void) {
    int test_ret = 0;

    int mem_base;
    xmlParserInputBufferPtr ret_val;
    const char * URI; /* a C string containing the URI or filename */
    int n_URI;
    xmlCharEncoding enc; /* the charset encoding if known */
    int n_enc;

    for (n_URI = 0;n_URI < gen_nb_fileoutput;n_URI++) {
    for (n_enc = 0;n_enc < gen_nb_xmlCharEncoding;n_enc++) {
        mem_base = xmlMemBlocks();
        URI = gen_fileoutput(n_URI, 0);
        enc = gen_xmlCharEncoding(n_enc, 1);

        ret_val = xmlParserInputBufferCreateFilename(URI, enc);
        desret_xmlParserInputBufferPtr(ret_val);
        call_tests++;
        des_fileoutput(n_URI, URI, 0);
        des_xmlCharEncoding(n_enc, enc, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlParserInputBufferCreateFilename",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_URI);
            printf(" %d", n_enc);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}